

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_terminator.h
# Opt level: O2

int __thiscall
PlayerTerminator::move(PlayerTerminator *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  int iVar1;
  pointer pMVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<Move,_std::allocator<Move>_> invertedMoveHistory;
  PlayerNext next;
  PlayerCopy copy;
  PlayerCycle_3 cycle_3;
  PlayerDelay delay;
  PlayerDelay_2 delay_2;
  string local_168;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  int local_130;
  int local_12c;
  Move local_128;
  PlayerNext local_120;
  ulong local_f0;
  ulong local_e8;
  PlayerCopy local_e0;
  PlayerCycle_3 local_b0;
  Player local_80;
  Player local_58;
  
  std::__cxx11::string::string((string *)&local_120,"terminator",(allocator *)&local_e0);
  PlayerDelay::PlayerDelay((PlayerDelay *)&local_80,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"terminator",(allocator *)&local_e0);
  PlayerDelay_2::PlayerDelay_2((PlayerDelay_2 *)&local_58,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_e0,"terminator",(allocator *)&local_b0);
  PlayerNext::PlayerNext(&local_120,(string *)&local_e0,0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_b0,"terminator",(allocator *)&local_168);
  PlayerCopy::PlayerCopy(&local_e0,(string *)&local_b0,0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_168,"terminator",(allocator *)&local_128);
  PlayerCycle_3::PlayerCycle_3(&local_b0,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  std::vector<Move,_std::allocator<Move>_>::reserve
            ((vector<Move,_std::allocator<Move>_> *)&local_168,
             (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  uVar8 = 0;
  local_138 = 0;
  local_140 = 0;
  local_148 = 0;
  uVar10 = 0;
  for (uVar9 = 0;
      uVar6 = (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3, uVar9 < uVar6; uVar9 = uVar9 + 1) {
    iVar3 = PlayerDelay::move((PlayerDelay *)&local_80,
                              (vector<Move,_std::allocator<Move>_> *)&local_168);
    local_12c = PlayerDelay_2::move((PlayerDelay_2 *)&local_58,
                                    (vector<Move,_std::allocator<Move>_> *)&local_168);
    local_f0 = uVar8;
    local_e8 = uVar10;
    iVar4 = PlayerNext::move(&local_120,(vector<Move,_std::allocator<Move>_> *)&local_168);
    piVar7 = (int *)(local_168._M_string_length + -4);
    if ((pointer)local_168._M_string_length == local_168._M_dataplus._M_p) {
      piVar7 = &local_e0.m_first;
    }
    iVar1 = *piVar7;
    local_130 = iVar3;
    iVar5 = PlayerCycle_3::move(&local_b0,(vector<Move,_std::allocator<Move>_> *)&local_168);
    pMVar2 = (moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = pMVar2[uVar9].m_you;
    local_128.m_you = pMVar2[uVar9].m_me;
    local_128.m_me = iVar3;
    std::vector<Move,_std::allocator<Move>_>::emplace_back<Move>
              ((vector<Move,_std::allocator<Move>_> *)&local_168,&local_128);
    local_138 = (ulong)((int)local_138 + (uint)(iVar5 == iVar3));
    uVar8 = (ulong)((int)local_f0 + (uint)(iVar1 == iVar3));
    local_140 = (ulong)((int)local_140 + (uint)(iVar4 == iVar3));
    local_148 = (ulong)((int)local_148 + (uint)(local_12c == iVar3));
    uVar10 = (ulong)((int)local_e8 + (uint)(local_130 == iVar3));
  }
  if (uVar6 < (uint)((int)local_138 * 2)) {
    iVar3 = PlayerCycle_3::move(&local_b0,(vector<Move,_std::allocator<Move>_> *)&local_168);
  }
  else if (uVar6 < (uint)((int)local_140 * 2)) {
    iVar3 = PlayerNext::move(&local_120,(vector<Move,_std::allocator<Move>_> *)&local_168);
  }
  else if (uVar6 < (uint)((int)local_148 * 2)) {
    iVar3 = PlayerDelay_2::move((PlayerDelay_2 *)&local_58,
                                (vector<Move,_std::allocator<Move>_> *)&local_168);
  }
  else if (uVar6 < (uint)((int)uVar10 * 2)) {
    iVar3 = PlayerDelay::move((PlayerDelay *)&local_80,
                              (vector<Move,_std::allocator<Move>_> *)&local_168);
  }
  else {
    if ((uint)((int)uVar8 * 2) <= uVar6) {
      iVar3 = PlayerDelay::move((PlayerDelay *)&local_80,moveHistory);
      goto LAB_00105c56;
    }
    piVar7 = (int *)(local_168._M_string_length + -4);
    if ((pointer)local_168._M_string_length == local_168._M_dataplus._M_p) {
      piVar7 = &local_e0.m_first;
    }
    iVar3 = *piVar7;
  }
  iVar3 = beats(iVar3);
LAB_00105c56:
  std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
            ((_Vector_base<Move,_std::allocator<Move>_> *)&local_168);
  Player::~Player(&local_b0.super_Player);
  Player::~Player(&local_e0.super_Player);
  Player::~Player(&local_120.super_Player);
  Player::~Player(&local_58);
  Player::~Player(&local_80);
  return iVar3;
}

Assistant:

int move(const std::vector<Move>& moveHistory)
   {
      PlayerDelay   delay("terminator");
      PlayerDelay_2 delay_2("terminator");
      PlayerNext    next("terminator", 0);
      PlayerCopy    copy("terminator", 0);
      PlayerCycle_3 cycle_3("terminator");

      // Loop over all the moves played so far, and count the number of times
      // the move played by the opponent matches that predicted by our local
      // instantiation of DELAY.
      std::vector<Move> invertedMoveHistory;
      invertedMoveHistory.reserve(moveHistory.size());   // Optimization
      unsigned int correctDelay   = 0;
      unsigned int correctDelay_2 = 0;
      unsigned int correctNext    = 0;
      unsigned int correctCopy    = 0;
      unsigned int correctCycle_3 = 0;
      for (size_t i=0; i<moveHistory.size(); ++i)
      {
         const int predictedMoveDelay   = delay.move(invertedMoveHistory);
         const int predictedMoveDelay_2 = delay_2.move(invertedMoveHistory);
         const int predictedMoveNext    = next.move(invertedMoveHistory);
         const int predictedMoveCopy    = copy.move(invertedMoveHistory);
         const int predictedMoveCycle_3 = cycle_3.move(invertedMoveHistory);
         const Move& playedMove = moveHistory[i];

         if (predictedMoveDelay == playedMove.m_you)
         {
            correctDelay += 1;
         }
         if (predictedMoveDelay_2 == playedMove.m_you)
         {
            correctDelay_2 += 1;
         }
         if (predictedMoveNext == playedMove.m_you)
         {
            correctNext += 1;
         }
         if (predictedMoveCopy == playedMove.m_you)
         {
            correctCopy += 1;
         }
         if (predictedMoveCycle_3 == playedMove.m_you)
         {
            correctCycle_3 += 1;
         }

         // Update moveHistory with the inverted moves (i.e. as seen by the
         // opponent).
         invertedMoveHistory.push_back(Move(playedMove.m_you, playedMove.m_me));
      }

#ifdef DEBUG
      std::cout << (correctDelay*100.0) / moveHistory.size() << "  " << std::endl;
#endif

      // Determine if the noves played by our opponent matches that of DELAY.
      // If so, play whatever beats DELAY. Otherwise, just copy DELAY's strategy.
      if (correctCycle_3*2 > moveHistory.size())
         return beats(cycle_3.move(invertedMoveHistory));
      else if (correctNext*2 > moveHistory.size())
         return beats(next.move(invertedMoveHistory));
      else if (correctDelay_2*2 > moveHistory.size())
         return beats(delay_2.move(invertedMoveHistory));
      else if (correctDelay*2 > moveHistory.size())
         return beats(delay.move(invertedMoveHistory));
      else if (correctCopy*2 > moveHistory.size())
         return beats(copy.move(invertedMoveHistory));
      else
         return delay.move(moveHistory);

   }